

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_rldnm(DisasContext_conflict10 *ctx,int mb,int me)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 ret;
  TCGv_i64 arg1;
  TCGv_i64 arg1_00;
  TCGv_i64 ret_00;
  target_ulong arg2;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  ret = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0xd & 0xf8));
  arg1 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0x12 & 0xf8));
  arg1_00 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 8 & 0xf8));
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_andi_i64_ppc64(tcg_ctx,ret_00,arg1_00,0x3f);
  tcg_gen_rotl_i64_ppc64(tcg_ctx,ret,arg1,ret_00);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  arg2 = MASK((ulong)(uint)mb,(ulong)(uint)me);
  tcg_gen_andi_i64_ppc64(tcg_ctx,ret,ret,arg2);
  if ((ctx->opcode & 1) == 0) {
    return;
  }
  gen_set_Rc0(ctx,ret);
  return;
}

Assistant:

static void gen_rldnm(DisasContext *ctx, int mb, int me)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t_ra = cpu_gpr[rA(ctx->opcode)];
    TCGv t_rs = cpu_gpr[rS(ctx->opcode)];
    TCGv t_rb = cpu_gpr[rB(ctx->opcode)];
    TCGv t0;

    t0 = tcg_temp_new(tcg_ctx);
    tcg_gen_andi_tl(tcg_ctx, t0, t_rb, 0x3f);
    tcg_gen_rotl_tl(tcg_ctx, t_ra, t_rs, t0);
    tcg_temp_free(tcg_ctx, t0);

    tcg_gen_andi_tl(tcg_ctx, t_ra, t_ra, MASK(mb, me));
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, t_ra);
    }
}